

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# molecule.cpp
# Opt level: O0

string * __thiscall indigox::Molecule::GetName_abi_cxx11_(Molecule *this)

{
  long in_RSI;
  string *in_RDI;
  
  std::__cxx11::string::string(in_RDI,(string *)(in_RSI + 0x18));
  return in_RDI;
}

Assistant:

String Molecule::GetName() const { return name_; }